

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O0

void stackjit::ByteCodeGenerator::generateClass(ostream *stream,Class *classDef)

{
  Class *pCVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  AttributeContainer *pAVar5;
  vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_> *this;
  reference this_00;
  Field *field;
  const_iterator __end1;
  const_iterator __begin1;
  vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_> *__range1;
  undefined1 local_88 [48];
  undefined1 local_58 [64];
  Class *local_18;
  Class *classDef_local;
  ostream *stream_local;
  
  local_18 = classDef;
  classDef_local = (Class *)stream;
  poVar3 = std::operator<<(stream,"class ");
  psVar4 = Loader::Class::name_abi_cxx11_(local_18);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  Loader::Class::parentClassName_abi_cxx11_((Class *)local_58);
  __range1._7_1_ = 0;
  __range1._5_1_ = 0;
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"");
  if (bVar2) {
    Loader::Class::parentClassName_abi_cxx11_((Class *)local_88);
    __range1._7_1_ = 1;
    std::operator+(local_58 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" extends ")
    ;
  }
  else {
    std::allocator<char>::allocator();
    __range1._5_1_ = 1;
    std::__cxx11::string::string((string *)(local_58 + 0x20),"",(allocator *)((long)&__range1 + 6));
  }
  poVar3 = std::operator<<(poVar3,(string *)(local_58 + 0x20));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(local_58 + 0x20));
  if ((__range1._5_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
  }
  if ((__range1._7_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)local_88);
  }
  std::__cxx11::string::~string((string *)local_58);
  poVar3 = std::operator<<((ostream *)classDef_local,"{");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pCVar1 = classDef_local;
  pAVar5 = Loader::Class::attributes_abi_cxx11_(local_18);
  generateAttributes((ostream *)pCVar1,pAVar5);
  this = Loader::Class::fields(local_18);
  __end1 = std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>::begin
                     (this);
  field = (Field *)std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>::
                   end(this);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_stackjit::Loader::Field_*,_std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>_>
                                     *)&field), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_stackjit::Loader::Field_*,_std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>_>
              ::operator*(&__end1);
    poVar3 = std::operator<<((ostream *)classDef_local,"\t");
    psVar4 = Loader::Field::name_abi_cxx11_(this_00);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3," ");
    psVar4 = Loader::Field::type_abi_cxx11_(this_00);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pCVar1 = classDef_local;
    pAVar5 = Loader::Field::attributes_abi_cxx11_(this_00);
    generateAttributes((ostream *)pCVar1,pAVar5);
    __gnu_cxx::
    __normal_iterator<const_stackjit::Loader::Field_*,_std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>_>
    ::operator++(&__end1);
  }
  poVar3 = std::operator<<((ostream *)classDef_local,"}");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ByteCodeGenerator::generateClass(std::ostream& stream, const Loader::Class& classDef) {
		stream << "class " << classDef.name()
			   << (classDef.parentClassName() != "" ? (" extends " + classDef.parentClassName()) : "")
			   << std::endl;
		stream << "{" << std::endl;

		generateAttributes(stream, classDef.attributes());

		for (auto& field : classDef.fields()) {
			stream << "\t" << field.name() << " " << field.type() << std::endl;
			generateAttributes(stream, field.attributes());
		}

		stream << "}" << std::endl;
	}